

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.h
# Opt level: O1

void adapt::cuf::detail::WriteInt<int>(ostringstream *str,int *arg,char mod)

{
  int iVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000011;
  char local_1;
  
  iVar1 = (int)CONCAT71(in_register_00000011,mod);
  switch(iVar1) {
  case 0x67:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)str,&local_1,1);
    return;
  case 0x68:
    std::ostream::operator<<(str,(short)*arg);
    return;
  case 0x69:
  case 0x6a:
  case 0x6b:
    goto switchD_0010da61_caseD_69;
  case 0x6c:
    std::ostream::_M_insert<long>((long)str);
    return;
  case 0x6d:
    std::ostream::_M_insert<long_long>((longlong)str);
    return;
  default:
    if ((iVar1 == 0x3f) || (iVar1 == 0)) {
      std::ostream::operator<<(str,*arg);
      return;
    }
switchD_0010da61_caseD_69:
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::__cxx11::string::pop_back;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
}

Assistant:

void WriteInt(std::ostringstream& str, const Value& arg, char mod)
{
	switch (mod)
	{
	case 0: Write<int>(str, arg); break;
	case 'l': Write<long>(str, arg); break;
	case 'm': Write<long long>(str, arg); break;
	case 'h': Write<short>(str, arg); break;
	case 'g': Write<char>(str, arg); break;
	case '?': WriteAnyInt(str, arg); break;
	default: throw std::exception(); break;
	}
}